

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O1

void __thiscall ANSIFontWriter::CalculateCharacterEncodingArray(ANSIFontWriter *this)

{
  __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  __first;
  __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  __last;
  long lVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  pair<unsigned_int,_GlyphEncodingInfo> local_50;
  
  p_Var2 = (this->mFontOccurrence->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 !=
      &(this->mFontOccurrence->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header) {
    do {
      local_50.first = p_Var2[1]._M_color;
      local_50.second.mEncodedCharacter = *(unsigned_short *)&p_Var2[1]._M_parent;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_50.second.mUnicodeCharacters,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var2[1]._M_left);
      std::
      vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>
      ::emplace_back<std::pair<unsigned_int,GlyphEncodingInfo>>
                ((vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>
                  *)&this->mCharactersVector,&local_50);
      if (local_50.second.mUnicodeCharacters.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.second.mUnicodeCharacters.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.second.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.second.mUnicodeCharacters.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 !=
             &(this->mFontOccurrence->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header);
  }
  __first._M_current =
       (this->mCharactersVector).
       super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->mCharactersVector).
       super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar3 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x3333333333333333;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,GlyphEncodingInfo>*,std::vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,GlyphEncodingInfo>const&,std::pair<unsigned_int,GlyphEncodingInfo>const&)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_int,_GlyphEncodingInfo>_&,_const_std::pair<unsigned_int,_GlyphEncodingInfo>_&)>
                )0x213f3e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,GlyphEncodingInfo>*,std::vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,GlyphEncodingInfo>const&,std::pair<unsigned_int,GlyphEncodingInfo>const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_int,_GlyphEncodingInfo>_&,_const_std::pair<unsigned_int,_GlyphEncodingInfo>_&)>
                )0x213f3e);
  }
  return;
}

Assistant:

void ANSIFontWriter::CalculateCharacterEncodingArray()
{
	// first we need to sort the fonts charachters by character code
	UIntToGlyphEncodingInfoMap::iterator it = mFontOccurrence->mGlyphIDToEncodedChar.begin();

	for(; it != mFontOccurrence->mGlyphIDToEncodedChar.end();++it)
		mCharactersVector.push_back(UIntAndGlyphEncodingInfo(it->first,it->second));

	std::sort(mCharactersVector.begin(),mCharactersVector.end(),sUShortSort);
}